

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

xmlCharEncError asciiToAscii(void *vctxt,uchar *out,int *poutlen,uchar *in,int *pinlen,int flush)

{
  uchar *puVar1;
  xmlCharEncError xVar2;
  xmlCharEncError xVar3;
  xmlCharEncError xVar4;
  xmlCharEncError xVar5;
  int iVar6;
  
  iVar6 = (int)in;
  if (in == (uchar *)0x0) {
    xVar5 = XML_ENC_ERR_SUCCESS;
    *pinlen = 0;
    *poutlen = 0;
  }
  else {
    xVar2 = *pinlen;
    xVar3 = *poutlen;
    xVar4 = xVar3;
    if (xVar2 <= xVar3) {
      xVar4 = xVar2;
    }
    xVar5 = XML_ENC_ERR_SPACE;
    if (xVar2 <= xVar3) {
      xVar5 = xVar2;
    }
    puVar1 = in + xVar4;
    *poutlen = xVar4;
    *pinlen = xVar4;
    for (; in < puVar1; in = in + 1) {
      if ((char)*in < '\0') {
        iVar6 = (int)in - iVar6;
        *poutlen = iVar6;
        *pinlen = iVar6;
        return XML_ENC_ERR_INPUT;
      }
      *out = *in;
      out = out + 1;
    }
  }
  return xVar5;
}

Assistant:

static xmlCharEncError
asciiToAscii(void *vctxt ATTRIBUTE_UNUSED,
             unsigned char* out, int *poutlen,
             const unsigned char* in, int *pinlen,
             int flush ATTRIBUTE_UNUSED) {
    const unsigned char *inend;
    const unsigned char *instart = in;
    int inlen, outlen, ret;

    if (in == NULL) {
        *pinlen = 0;
        *poutlen = 0;
        return(XML_ENC_ERR_SUCCESS);
    }

    inlen = *pinlen;
    outlen = *poutlen;

    if (outlen < inlen) {
        inlen = outlen;
        ret = XML_ENC_ERR_SPACE;
    } else {
        ret = inlen;
    }

    inend = in + inlen;
    *poutlen = inlen;
    *pinlen = inlen;

    while (in < inend) {
	unsigned c = *in;

        if (c >= 0x80) {
	    *poutlen = in - instart;
	    *pinlen = in - instart;
	    return(XML_ENC_ERR_INPUT);
	}

        in++;
	*out++ = c;
    }

    return(ret);
}